

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

void ma_pcm_u8_to_f32(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  ma_uint64 i;
  
  for (i = 0; count != i; i = i + 1) {
    *(float *)((long)dst + i * 4) = (float)*(byte *)((long)src + i) * 0.007843138 + -1.0;
  }
  return;
}

Assistant:

MA_API void ma_pcm_u8_to_f32(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_u8_to_f32__reference(dst, src, count, ditherMode);
#else
    #  if MA_PREFERRED_SIMD == MA_SIMD_AVX2
        if (ma_has_avx2()) {
            ma_pcm_u8_to_f32__avx2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_SSE2
        if (ma_has_sse2()) {
            ma_pcm_u8_to_f32__sse2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_NEON
        if (ma_has_neon()) {
            ma_pcm_u8_to_f32__neon(dst, src, count, ditherMode);
        } else
    #endif
        {
            ma_pcm_u8_to_f32__optimized(dst, src, count, ditherMode);
        }
#endif
}